

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_doing(Curl_easy *data,_Bool *dophase_done)

{
  CURLcode CVar1;
  undefined1 connected;
  
  connected = SUB81(dophase_done,0);
  CVar1 = imap_multi_statemach(data,dophase_done);
  if ((CVar1 == CURLE_OK) && (*dophase_done == true)) {
    imap_dophase_done(data,(_Bool)connected);
  }
  return CVar1;
}

Assistant:

static CURLcode imap_doing(struct Curl_easy *data, bool *dophase_done)
{
  CURLcode result = imap_multi_statemach(data, dophase_done);

  if(result)
    DEBUGF(infof(data, "DO phase failed"));
  else if(*dophase_done) {
    result = imap_dophase_done(data, FALSE /* not connected */);

    DEBUGF(infof(data, "DO phase is complete"));
  }

  return result;
}